

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSorter.cpp
# Opt level: O2

void sortHeaders(vector<Header,_std::allocator<Header>_> *headers)

{
  size_type sVar1;
  ulong uVar2;
  iterator iVar3;
  vector<Header,_std::allocator<Header>_> *__range1;
  pointer pHVar4;
  ulong uVar5;
  ulong uVar6;
  __node_base *p_Var7;
  long lVar8;
  undefined1 local_78 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  observedIDs;
  uint local_34;
  
LAB_0010a2c8:
  local_78 = (undefined1  [8])&observedIDs._M_h._M_rehash_policy._M_next_resize;
  observedIDs._M_h._M_buckets = (__buckets_ptr)0x1;
  observedIDs._M_h._M_bucket_count = 0;
  observedIDs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  observedIDs._M_h._M_element_count._0_4_ = 0x3f800000;
  observedIDs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  observedIDs._M_h._M_rehash_policy._4_4_ = 0;
  observedIDs._M_h._M_rehash_policy._M_next_resize = 0;
  pHVar4 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
           super__Vector_impl_data._M_start;
  observedIDs._M_h._M_single_bucket =
       (__node_base_ptr)
       (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  uVar6 = 0;
  do {
    if (pHVar4 == (pointer)observedIDs._M_h._M_single_bucket) {
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_78);
      return;
    }
    local_34 = (uint)pHVar4->m_id;
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_emplace<unsigned_int>
              ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_78,&local_34);
    p_Var7 = &(pHVar4->m_dependancies)._M_h._M_before_begin;
    while( true ) {
      p_Var7 = p_Var7->_M_nxt;
      if (p_Var7 == (__node_base *)0x0) break;
      sVar1 = *(size_type *)(p_Var7 + 1);
      local_34 = (uint)(ushort)sVar1;
      iVar3 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)local_78,&local_34);
      if (iVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        pHVar4 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = uVar6;
        goto LAB_0010a36b;
      }
    }
    uVar6 = (ulong)((int)uVar6 + 1);
    pHVar4 = pHVar4 + 1;
  } while( true );
  while (uVar2 = (ulong)((int)uVar5 + 1), pHVar4[uVar5].m_id != (ushort)sVar1) {
LAB_0010a36b:
    uVar5 = uVar2;
    if ((ulong)(((long)(headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pHVar4) / 0xb0) <= uVar5) {
      uVar5 = 0xffffffff;
      break;
    }
  }
  lVar8 = uVar5 * 0xb0;
  while (uVar6 < uVar5) {
    pHVar4 = (headers->super__Vector_base<Header,_std::allocator<Header>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = uVar5 - 1;
    std::swap<Header>((Header *)((long)&(pHVar4->m_fileContents)._M_dataplus._M_p + lVar8),
                      pHVar4 + (uVar5 & 0xffffffff));
    lVar8 = lVar8 + -0xb0;
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_78);
  goto LAB_0010a2c8;
}

Assistant:

void sortHeaders(std::vector<Header>& headers)
{
    /*
    std::vector<Header> sortedHeaders;

    for (auto& header : headers) {
        bool hasDependancy = false;
        std::cout << "ITR\n";
        for (int i = 0; i < sortedHeaders.size(); i++) {
            auto& d = header.getDependancies();
            if (d.find(sortedHeaders[i].getID()) != d.end()) {
                sortedHeaders.insert(sortedHeaders.begin(), header);
                hasDependancy = true;
                break;
            }
        }
        if (!hasDependancy) {
            sortedHeaders.push_back(header);
        }
    }

    headers = sortedHeaders;
    */
   while (!isSorted(headers));
}